

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEventSubscribe.c
# Opt level: O3

int UpnpEventSubscribe_assign(UpnpEventSubscribe *p,UpnpEventSubscribe *q)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  if (p != q) {
    iVar1 = q->m_TimeOut;
    p->m_ErrCode = q->m_ErrCode;
    p->m_TimeOut = iVar1;
    pcVar3 = UpnpString_get_String(q->m_SID);
    iVar1 = UpnpString_set_String(p->m_SID,pcVar3);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      pcVar3 = UpnpString_get_String(q->m_PublisherUrl);
      iVar1 = UpnpString_set_String(p->m_PublisherUrl,pcVar3);
      uVar2 = (uint)(iVar1 != 0);
    }
    return uVar2;
  }
  return 1;
}

Assistant:

int UpnpEventSubscribe_assign(
	UpnpEventSubscribe *p, const UpnpEventSubscribe *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpEventSubscribe_set_ErrCode(
				   p, UpnpEventSubscribe_get_ErrCode(q));
		ok = ok && UpnpEventSubscribe_set_TimeOut(
				   p, UpnpEventSubscribe_get_TimeOut(q));
		ok = ok && UpnpEventSubscribe_set_SID(
				   p, UpnpEventSubscribe_get_SID(q));
		ok = ok && UpnpEventSubscribe_set_PublisherUrl(
				   p, UpnpEventSubscribe_get_PublisherUrl(q));
	}

	return ok;
}